

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O0

int __thiscall n_pca::NPca::detector(NPca *this,Mat *image)

{
  int iVar1;
  Mat local_78 [96];
  Mat *local_18;
  Mat *image_local;
  NPca *this_local;
  
  local_18 = image;
  image_local = (Mat *)this;
  if ((*(int *)(image + 0xc) != this->n_config_->image_width_) ||
     (*(int *)(image + 8) != this->n_config_->image_height_)) {
    n_resize(this,image);
  }
  cv::Mat::reshape((int)local_78,(int)image);
  cv::Mat::operator=(image,local_78);
  cv::Mat::~Mat(local_78);
  iVar1 = detector(this,*(u_char **)(image + 0x10));
  return iVar1;
}

Assistant:

int NPca::detector(Mat image)
{
    if (image.cols != n_config_->image_width_ || image.rows != n_config_->image_height_)
    {
        n_resize(image);
    }

    image = image.reshape(0,1);
    
    return detector(image.data);
}